

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O1

void __thiscall timing_registry::addToGroup(timing_registry *this,uint64_t guid,task_handle *hTask)

{
  __buckets_ptr pp_Var1;
  int iVar2;
  __node_base_ptr p_Var3;
  undefined8 uVar4;
  __hash_code __code;
  __node_base_ptr p_Var5;
  ulong uVar6;
  _Hash_node_base *p_Var7;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
    uVar4 = std::__throw_system_error(iVar2);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    _Unwind_Resume(uVar4);
  }
  oqpi::task_handle::validate(hTask);
  p_Var7 = (_Hash_node_base *)
           ((hTask->spTask_).super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->uid_;
  pp_Var1 = (this->tasks)._M_h._M_buckets;
  uVar6 = (this->tasks)._M_h._M_bucket_count;
  p_Var3 = pp_Var1[(ulong)p_Var7 % uVar6];
  for (p_Var5 = p_Var3->_M_nxt; p_Var7 != p_Var5[1]._M_nxt; p_Var5 = p_Var5->_M_nxt) {
    p_Var3 = p_Var5;
  }
  p_Var3->_M_nxt[0xf]._M_nxt = (_Hash_node_base *)guid;
  uVar6 = guid % uVar6;
  p_Var3 = pp_Var1[uVar6];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var3 != (__node_base_ptr)0x0) &&
     (p_Var5 = p_Var3, p_Var3->_M_nxt[1]._M_nxt != (_Hash_node_base *)guid)) {
    p_Var7 = p_Var3->_M_nxt;
    while (p_Var3 = p_Var7, p_Var7 = p_Var3->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var7[1]._M_nxt % (this->tasks)._M_h._M_bucket_count != uVar6) ||
         (p_Var5 = p_Var3, p_Var7[1]._M_nxt == (_Hash_node_base *)guid)) goto LAB_0017af22;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_0017af22:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var7 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var7 = p_Var5->_M_nxt;
  }
  std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::
  emplace_back<oqpi::task_handle>
            ((vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *)(p_Var7 + 0xb),hTask);
  *(undefined1 *)&p_Var7[0xe]._M_nxt = 1;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void addToGroup(uint64_t guid, oqpi::task_handle hTask)
    {
        std::lock_guard<std::recursive_mutex> __l(m);
        // Flag the task as having a parent
        auto tit = tasks.find(hTask.getUID());
        tit->second.parentUID = guid;
        // Add this task to the parent
        auto git = tasks.find(guid);
        git->second.children.emplace_back(std::move(hTask));
        git->second.isGroup = true;
    }